

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O1

void Npn_ManResize(Npn_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int *__ptr;
  Npn_Obj_t *pNVar3;
  word wVar4;
  uint uVar5;
  int *piVar6;
  Npn_Obj_t *pNVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  Npn_Obj_t *pNVar13;
  Npn_Obj_t *pNVar14;
  timespec ts;
  timespec tStack_38;
  
  if (p->pBins == (int *)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                  ,0x18d,"void Npn_ManResize(Npn_Man_t *)");
  }
  clock_gettime(3,&tStack_38);
  __ptr = p->pBins;
  uVar1 = p->nBins;
  uVar8 = uVar1 * 3 - 1;
  while( true ) {
    do {
      uVar9 = uVar8 + 1;
      uVar5 = uVar8 & 1;
      uVar8 = uVar9;
    } while (uVar5 != 0);
    if (uVar9 < 9) break;
    iVar11 = 5;
    while (uVar9 % (iVar11 - 2U) != 0) {
      uVar5 = iVar11 * iVar11;
      iVar11 = iVar11 + 2;
      if (uVar9 < uVar5) goto LAB_00282829;
    }
  }
LAB_00282829:
  p->nBins = uVar9;
  piVar6 = (int *)calloc((long)(int)uVar9,4);
  p->pBins = piVar6;
  if ((int)uVar1 < 1) {
    iVar11 = 1;
  }
  else {
    iVar2 = p->nBufferSize;
    iVar11 = 1;
    uVar12 = 0;
    do {
      iVar10 = __ptr[uVar12];
      if (iVar2 <= iVar10) {
LAB_00282963:
        __assert_fail("i < p->nBufferSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                      ,0x31,"Npn_Obj_t *Npn_ManObj(Npn_Man_t *, int)");
      }
      if (iVar10 == 0) {
        pNVar14 = (Npn_Obj_t *)0x0;
      }
      else {
        pNVar14 = p->pBuffer + iVar10;
      }
      if (pNVar14 == (Npn_Obj_t *)0x0) {
LAB_00282895:
        pNVar7 = (Npn_Obj_t *)0x0;
      }
      else {
        iVar10 = pNVar14->iNext;
        if (iVar2 <= iVar10) goto LAB_00282963;
        if (iVar10 == 0) goto LAB_00282895;
        pNVar7 = p->pBuffer + iVar10;
      }
      if (pNVar14 != (Npn_Obj_t *)0x0) {
        pNVar3 = p->pBuffer;
        do {
          pNVar13 = pNVar7;
          wVar4 = pNVar14->uTruth;
          iVar10 = (int)((wVar4 * 0x6f1 ^ wVar4 * 0x2dd ^ wVar4 * 0x65) % (ulong)(long)(int)uVar9);
          pNVar14->iNext = piVar6[iVar10];
          if (pNVar14 <= pNVar3) {
            __assert_fail("p->pBuffer < pObj",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                          ,0x32,"int Npn_ManObjNum(Npn_Man_t *, Npn_Obj_t *)");
          }
          piVar6[iVar10] = (int)((ulong)((long)pNVar14 - (long)pNVar3) >> 4);
          if (pNVar13 == (Npn_Obj_t *)0x0) {
            pNVar7 = (Npn_Obj_t *)0x0;
          }
          else {
            iVar10 = pNVar13->iNext;
            if (iVar2 <= iVar10) goto LAB_00282963;
            pNVar7 = (Npn_Obj_t *)0x0;
            if (iVar10 != 0) {
              pNVar7 = pNVar3 + iVar10;
            }
          }
          iVar11 = iVar11 + 1;
          pNVar14 = pNVar13;
        } while (pNVar13 != (Npn_Obj_t *)0x0);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar1);
  }
  if (iVar11 != p->nEntries) {
    __assert_fail("Counter == p->nEntries",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcNpnSave.c"
                  ,0x1a5,"void Npn_ManResize(Npn_Man_t *)");
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Npn_ManResize( Npn_Man_t * p )
{
    Npn_Obj_t * pEntry, * pNext;
    int * pBinsOld, * ppPlace;
    int nBinsOld, Counter, i;
    abctime clk;
    assert( p->pBins != NULL );
clk = Abc_Clock();
    // save the old Bins
    pBinsOld = p->pBins;
    nBinsOld = p->nBins;
    // get the new Bins
    p->nBins = Abc_PrimeCudd( 3 * nBinsOld ); 
    p->pBins = ABC_CALLOC( int, p->nBins );
    // rehash the entries from the old table
    Counter = 1;
    for ( i = 0; i < nBinsOld; i++ )
    for ( pEntry = Npn_ManObj(p, pBinsOld[i]), 
          pNext = pEntry ? Npn_ManObj(p, pEntry->iNext) : NULL; 
          pEntry; 
          pEntry = pNext, 
          pNext = pEntry ? Npn_ManObj(p, pEntry->iNext) : NULL )
    {
        // get the place where this entry goes 
        ppPlace = p->pBins + Npn_ManHash( p, pEntry->uTruth );
        // add the entry to the list
        pEntry->iNext = *ppPlace;
        *ppPlace = Npn_ManObjNum( p, pEntry );
        Counter++;
    }
    assert( Counter == p->nEntries );
    ABC_FREE( pBinsOld );
//ABC_PRT( "Hash table resizing time", Abc_Clock() - clk );
}